

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
::resize(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
         *this,size_t new_capacity)

{
  size_t hash;
  ctrl_t *p;
  size_t capacity;
  undefined1 auVar1 [16];
  size_t i;
  size_t sVar2;
  slot_type *old_slot;
  FindInfo FVar3;
  Layout LVar4;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x72d,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::resize(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
                 );
  }
  p = this->ctrl_;
  old_slot = this->slots_;
  capacity = this->capacity_;
  this->capacity_ = new_capacity;
  initialize_slots(this);
  for (sVar2 = 0; capacity != sVar2; sVar2 = sVar2 + 1) {
    if (-1 < p[sVar2]) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (old_slot->value).first;
      hash = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
             SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0);
      FVar3 = find_first_non_full(this,hash);
      set_ctrl(this,FVar3.offset,(byte)hash & 0x7f);
      map_slot_policy<unsigned_long,std::shared_ptr<ThreadState>>::
      transfer<std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                ((allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_> *)
                 &this->settings_,this->slots_ + FVar3.offset,old_slot);
    }
    old_slot = old_slot + 1;
  }
  if (capacity != 0) {
    LVar4 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
              ((allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_> *)
               &this->settings_,p,
               LVar4.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::shared_ptr<ThreadState>_>_>
               .size_[1] * 0x18 +
               (LVar4.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::shared_ptr<ThreadState>_>_>
                .size_[0] + 7 & 0xfffffffffffffff8));
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }